

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_replace_string(JSON_Array *array,size_t i,char *string)

{
  JSON_Status JVar1;
  JSON_Value *value_00;
  JSON_Value *in_RDX;
  JSON_Array *in_RSI;
  JSON_Value *value;
  char *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  value_00 = json_value_init_string(in_stack_ffffffffffffffd8);
  if (value_00 == (JSON_Value *)0x0) {
    local_4 = -1;
  }
  else {
    JVar1 = json_array_replace_value(in_RSI,(size_t)in_RDX,value_00);
    if (JVar1 == 0) {
      local_4 = 0;
    }
    else {
      json_value_free(in_RDX);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

JSON_Status json_array_replace_string(JSON_Array *array, size_t i, const char* string) {
    JSON_Value *value = json_value_init_string(string);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_array_replace_value(array, i, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}